

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::TestacceptorFixtureprocessQueuedMessages::RunImpl
          (TestacceptorFixtureprocessQueuedMessages *this)

{
  TestDetails *details;
  acceptorFixtureprocessQueuedMessagesHelper fixtureHelper;
  acceptorFixtureprocessQueuedMessagesHelper local_660;
  
  details = &(this->super_Test).m_details;
  acceptorFixtureprocessQueuedMessagesHelper::acceptorFixtureprocessQueuedMessagesHelper
            (&local_660,details);
  UnitTest::ExecuteTest<SuiteSessionTests::acceptorFixtureprocessQueuedMessagesHelper>
            (&local_660,details);
  sessionFixture::~sessionFixture((sessionFixture *)&local_660);
  return;
}

Assistant:

TEST_FIXTURE(acceptorFixture, processQueuedMessages)
{
  object->setResponder( this );
  object->next( createLogon( "ISLD", "TW", 1 ), UtcTimeStamp() );
  CHECK_EQUAL( 0, disconnected );

  for( int i = 3; i <= 5003; ++i )
  {
    object->next( createNewOrderSingle( "ISLD", "TW", i ), UtcTimeStamp() );
  }
  CHECK_EQUAL( 2, object->getExpectedTargetNum() );
  CHECK_EQUAL( 1, toResendRequest );
  object->next( createNewOrderSingle( "ISLD", "TW", 2 ), UtcTimeStamp() );
  CHECK_EQUAL( 5004, object->getExpectedTargetNum() );
  object->next( createNewOrderSingle( "ISLD", "TW", 5006 ), UtcTimeStamp() );
  CHECK_EQUAL( 2, toResendRequest );
}